

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SpectrumConstantTexture *
pbrt::SpectrumConstantTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Allocator alloc_00;
  uintptr_t iptr;
  allocator<char> local_59;
  SpectrumHandle c;
  NamedTextures *local_50;
  string local_48 [32];
  
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0x3f800000;
  std::__cxx11::string::string<std::allocator<char>>(local_48,"value",&local_59);
  alloc_00.memoryResource._4_4_ = 0;
  alloc_00.memoryResource._0_4_ = spectrumType;
  local_50 = (NamedTextures *)(CONCAT44(extraout_var,iVar1) | 0x1000000000000);
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)&c,(string *)parameters,(SpectrumHandle *)local_48,
             (SpectrumType)&local_50,alloc_00);
  std::__cxx11::string::~string(local_48);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8);
  (((SpectrumConstantTexture *)CONCAT44(extraout_var_00,iVar1))->value).
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (uintptr_t)
          c.
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
          .bits;
  return (SpectrumConstantTexture *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

SpectrumConstantTexture *SpectrumConstantTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);
    SpectrumHandle c = parameters.GetOneSpectrum("value", one, spectrumType, alloc);
    return alloc.new_object<SpectrumConstantTexture>(c);
}